

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primref_mb.h
# Opt level: O2

void std::__move_median_to_first<embree::PrimRefMB*,__gnu_cxx::__ops::_Iter_less_iter>
               (PrimRefMB *__result,PrimRefMB *__a,PrimRefMB *__b,PrimRefMB *__c)

{
  PrimRefMB *__b_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = CONCAT44((__a->lbounds).bounds0.upper.field_0.m128[3],
                   (__a->lbounds).bounds0.lower.field_0.m128[3]);
  uVar2 = CONCAT44((__b->lbounds).bounds0.upper.field_0.m128[3],
                   (__b->lbounds).bounds0.lower.field_0.m128[3]);
  uVar3 = CONCAT44((__c->lbounds).bounds0.upper.field_0.m128[3],
                   (__c->lbounds).bounds0.lower.field_0.m128[3]);
  if (uVar1 < uVar2) {
    __b_00 = __b;
    if ((uVar3 <= uVar2) && (__b_00 = __a, uVar1 < uVar3)) {
      __b_00 = __c;
    }
  }
  else {
    __b_00 = __a;
    if ((uVar3 <= uVar1) && (__b_00 = __b, uVar2 < uVar3)) {
      __b_00 = __c;
    }
  }
  swap<embree::PrimRefMB>(__result,__b_00);
  return;
}

Assistant:

__forceinline unsigned geomID() const {
      return lbounds.bounds0.lower.a;
    }